

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::
VisitKeyType<google::protobuf::internal::UntypedMapBase::UntypedMergeFrom(google::protobuf::internal::UntypedMapBase_const&)::__1>
          (UntypedMapBase *this,anon_class_24_3_9faf7474 f)

{
  TypeKind TVar1;
  UntypedMapBase *this_local;
  
  TVar1 = TypeInfo::key_type_kind(&this->type_info_);
  switch(TVar1) {
  case kBool:
    UntypedMergeFrom(google::protobuf::internal::UntypedMapBase_const&)::$_1::operator()((__1 *)&f);
    break;
  case kU32:
    UntypedMergeFrom(google::protobuf::internal::UntypedMapBase_const&)::$_1::operator()((__1 *)&f);
    break;
  case kU64:
    UntypedMergeFrom(google::protobuf::internal::UntypedMapBase_const&)::$_1::operator()((__1 *)&f);
    break;
  case kFloat:
  case kDouble:
  case kMessage:
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                ,0x1f0);
  case kString:
    UntypedMergeFrom(google::protobuf::internal::UntypedMapBase_const&)::$_1::operator()((__1 *)&f);
  }
  return;
}

Assistant:

auto UntypedMapBase::VisitKeyType(F f) const {
  switch (type_info_.key_type_kind()) {
    case TypeKind::kBool:
      return f(std::enable_if<true, bool>{});
    case TypeKind::kU32:
      return f(std::enable_if<true, uint32_t>{});
    case TypeKind::kU64:
      return f(std::enable_if<true, uint64_t>{});
    case TypeKind::kString:
      return f(std::enable_if<true, std::string>{});

    case TypeKind::kFloat:
    case TypeKind::kDouble:
    case TypeKind::kMessage:
    default:
      Unreachable();
  }
}